

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O1

int tidyCleanAndRepair(TidyDoc tdoc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  undefined8 uVar12;
  Node *node;
  Dict *pDVar13;
  uint code;
  Bool BVar14;
  Bool BVar15;
  Bool BVar16;
  uint uVar17;
  Node *pNVar18;
  AttVal *pAVar19;
  tmbstr ptVar20;
  Stack *pSVar21;
  Node *pNVar22;
  long lVar23;
  TidyTagId TVar24;
  char *property;
  AttVal *attval;
  uint uVar25;
  TidyDocImpl *impl;
  bool bVar26;
  bool bVar27;
  
  if (tdoc == (TidyDoc)0x0) {
    return -0x16;
  }
  iVar1 = tdoc[0xd0]._opaque;
  iVar2 = tdoc[0x78]._opaque;
  iVar3 = tdoc[0x7e]._opaque;
  BVar16 = tdoc[0x24]._opaque;
  iVar4 = tdoc[0x5c]._opaque;
  iVar5 = tdoc[0x60]._opaque;
  iVar6 = tdoc[0xe6]._opaque;
  iVar7 = tdoc[0xe2]._opaque;
  iVar8 = tdoc[0xe4]._opaque;
  iVar9 = tdoc[0x80]._opaque;
  iVar10 = tdoc[0x84]._opaque;
  uVar12 = *(undefined8 *)(tdoc + 0xd08);
  *(undefined8 *)(tdoc + 0xd08) = 0;
  if (tdoc[0xec]._opaque == 0) {
    prvTidyCleanStyle((TidyDocImpl *)tdoc,(Node *)tdoc);
    if (iVar10 != 0) {
      prvTidyNestedEmphasis((TidyDocImpl *)tdoc,(Node *)tdoc);
    }
    prvTidyList2BQ((TidyDocImpl *)tdoc,(Node *)tdoc);
    prvTidyBQ2Div((TidyDocImpl *)tdoc,(Node *)tdoc);
    if (iVar2 != 0) {
      prvTidyEmFromI((TidyDocImpl *)tdoc,(Node *)tdoc);
    }
    if ((iVar1 != 0) && (BVar15 = prvTidyIsWord2000((TidyDocImpl *)tdoc), BVar15 != no)) {
      prvTidyDropSections((TidyDocImpl *)tdoc,(Node *)tdoc);
      prvTidyCleanWord2000((TidyDocImpl *)tdoc,(Node *)tdoc);
      prvTidyDropEmptyElements((TidyDocImpl *)tdoc,(Node *)tdoc);
    }
    if (iVar3 != 0) {
      prvTidyCleanDocument((TidyDocImpl *)tdoc);
    }
    if (iVar4 != 0) {
      prvTidyCleanGoogleDocument((TidyDocImpl *)tdoc);
    }
    prvTidyTidyMetaCharset((TidyDocImpl *)tdoc);
    BVar15 = prvTidyCheckNodeIntegrity((Node *)tdoc);
    if (BVar15 == no) {
      (**(code **)(**(long **)(tdoc + 0xd20) + 0x18))
                (*(long **)(tdoc + 0xd20),"\nPanic - tree has lost its integrity\n");
    }
    pNVar18 = prvTidyFindDocType((TidyDocImpl *)tdoc);
    if (((pNVar18 != (Node *)0x0) &&
        (pAVar19 = prvTidyGetAttrByName(pNVar18,"PUBLIC"), pAVar19 != (AttVal *)0x0)) &&
       (pAVar19->value != (tmbstr)0x0)) {
      if (*(long *)(tdoc + 0xd2a) != 0) {
        (**(code **)(**(long **)(tdoc + 0xd20) + 0x10))();
      }
      ptVar20 = prvTidytmbstrdup(*(TidyAllocator **)(tdoc + 0xd20),pAVar19->value);
      *(tmbstr *)(tdoc + 0xd2a) = ptVar20;
    }
    if (*(long *)(tdoc + 6) != 0) {
      if (((iVar5 != 0) && (*(int *)(*(long *)(tdoc + 0x1c) + 0x1c) != 0)) &&
         (pNVar18 = prvTidyFindDocType((TidyDocImpl *)tdoc), pNVar18 != (Node *)0x0)) {
        prvTidyRemoveNode(pNVar18);
      }
      if ((iVar5 == 0) && (iVar7 != 0)) {
        prvTidySetXHTMLDocType((TidyDocImpl *)tdoc);
        BVar15 = yes;
      }
      else {
        prvTidyFixDocType((TidyDocImpl *)tdoc);
        BVar15 = no;
      }
      prvTidyFixAnchors((TidyDocImpl *)tdoc,(Node *)tdoc,BVar16,yes);
      prvTidyFixXhtmlNamespace((TidyDocImpl *)tdoc,BVar15);
      prvTidyFixLanguageInformation((TidyDocImpl *)tdoc,(Node *)tdoc,BVar15,yes);
      if (iVar9 != 0) {
        prvTidyAddGenerator((TidyDocImpl *)tdoc);
      }
    }
    if ((iVar6 != 0) && (iVar8 != 0)) {
      prvTidyFixXmlDecl((TidyDocImpl *)tdoc);
    }
    if (*(long *)(tdoc + 0x1c) != 0) {
      if ((*(byte *)(*(long *)(tdoc + 0x1c) + 0x2a) & 6) != 0) {
        pSVar21 = prvTidynewStack((TidyDocImpl *)tdoc,0x10);
        iVar1 = tdoc[0x7e]._opaque;
        iVar2 = tdoc[0xc0]._opaque;
        pNVar22 = prvTidyFindBody((TidyDocImpl *)tdoc);
        pNVar18 = (Node *)tdoc;
        do {
          node = pNVar18->next;
          for (pAVar19 = pNVar18->attributes; pAVar19 != (AttVal *)0x0; pAVar19 = pAVar19->next) {
            if ((pAVar19->dict != (Attribute *)0x0) && (pAVar19->dict->id == TidyAttr_ALIGN)) {
              if (iVar2 == 0) {
                pAVar19 = prvTidyAttrGetById(pNVar18,TidyAttr_ALIGN);
                prvTidyReportAttrError((TidyDocImpl *)tdoc,pNVar18,pAVar19,0x255);
              }
              break;
            }
          }
          if (pNVar18 == pNVar22) {
            if (iVar2 == 0) {
              lVar23 = 0;
              do {
                pAVar19 = prvTidyAttrGetById(pNVar18,*(TidyAttrId *)((long)BadBody5Attribs + lVar23)
                                            );
                if (pAVar19 != (AttVal *)0x0) {
                  prvTidyReportAttrError((TidyDocImpl *)tdoc,pNVar18,pAVar19,0x255);
                }
                lVar23 = lVar23 + 4;
              } while (lVar23 != 0x18);
            }
          }
          else if (pNVar18->tag == (Dict *)0x0) {
LAB_00154a7f:
            BVar16 = prvTidynodeIsElement(pNVar18);
            if ((BVar16 != no) && (pDVar13 = pNVar18->tag, pDVar13 != (Dict *)0x0)) {
              if ((pDVar13->versions & 0x6e000) == 0) goto LAB_00154b55;
              lVar23 = 8;
              do {
                if (*(TidyTagId *)((long)&html5Info[0].tag + lVar23) == pDVar13->id)
                goto LAB_00154b55;
                lVar23 = lVar23 + 0x10;
              } while (lVar23 != 200);
            }
          }
          else {
            TVar24 = pNVar18->tag->id;
            if ((int)TVar24 < 0x24) {
              if ((int)TVar24 < 0xd) {
                if (TVar24 == TidyTag_ACRONYM) {
                  if (iVar1 != 0) {
                    TVar24 = TidyTag_ABBR;
LAB_00154b46:
                    prvTidyCoerceNode((TidyDocImpl *)tdoc,pNVar18,TVar24,yes,no);
                    goto LAB_00154b70;
                  }
                }
                else if (TVar24 == TidyTag_APPLET) {
                  if (iVar1 != 0) {
                    TVar24 = TidyTag_OBJECT;
                    goto LAB_00154b46;
                  }
                }
                else if (TVar24 != TidyTag_BASEFONT) goto LAB_00154a7f;
              }
              else if (TVar24 == TidyTag_BIG) {
                if (iVar1 != 0) {
                  property = "font-size: larger";
                  goto LAB_00154b36;
                }
              }
              else if ((TVar24 != TidyTag_CENTER) && (TVar24 != TidyTag_DIR)) goto LAB_00154a7f;
            }
            else if ((int)TVar24 < 0x48) {
              if ((1 < TVar24 - TidyTag_FRAME) && (TVar24 != TidyTag_FONT)) goto LAB_00154a7f;
            }
            else if (TVar24 != TidyTag_NOFRAMES) {
              if (TVar24 == TidyTag_STRIKE) {
                if (iVar1 != 0) {
                  property = "text-decoration: line-through";
LAB_00154b36:
                  prvTidyAddStyleProperty((TidyDocImpl *)tdoc,pNVar18,property);
                  TVar24 = TidyTag_SPAN;
                  goto LAB_00154b46;
                }
              }
              else {
                if (TVar24 != TidyTag_TT) goto LAB_00154a7f;
                if (iVar1 != 0) {
                  property = "font-family: monospace";
                  goto LAB_00154b36;
                }
              }
            }
LAB_00154b55:
            if (iVar2 == 0) {
              prvTidyReport((TidyDocImpl *)tdoc,pNVar18,pNVar18,0x271);
            }
          }
LAB_00154b70:
          if (pNVar18->content == (Node *)0x0) {
            pNVar18 = node;
            if (node == (Node *)0x0) {
              pNVar18 = prvTidypop(pSVar21);
            }
          }
          else {
            prvTidypush(pSVar21,node);
            pNVar18 = pNVar18->content;
          }
        } while (pNVar18 != (Node *)0x0);
        prvTidyfreeStack(pSVar21);
      }
      pSVar21 = prvTidynewStack((TidyDocImpl *)tdoc,0x10);
      uVar17 = *(uint *)(*(long *)(tdoc + 0x1c) + 0x24);
      uVar11 = *(uint *)(*(long *)(tdoc + 0x1c) + 0x28);
      if (uVar11 == 0) {
        uVar11 = uVar17;
      }
      bVar26 = (uVar11 & 0x60124) == 0;
      iVar1 = tdoc[0xc0]._opaque;
      bVar27 = (uVar17 & 0x60000) == 0;
      pNVar18 = (Node *)tdoc;
      uVar25 = (iVar1 == 0) + 0x254;
      if (bVar27) {
        uVar25 = bVar26 | 0x254;
      }
      do {
        pNVar22 = pNVar18->next;
        BVar16 = prvTidynodeIsElement(pNVar18);
        if (((BVar16 != no) && (pDVar13 = pNVar18->tag, pDVar13 != (Dict *)0x0)) &&
           (tdoc[0xec]._opaque == 0)) {
          if ((iVar1 == 0) || ((pDVar13->versions & uVar11) != 0)) {
            if (((pDVar13->versions & 0xe000) != 0) &&
               ((tdoc[0x7e]._opaque == 0 ||
                ((pDVar13->id != TidyTag_NOBR && (pDVar13->id != TidyTag_WBR)))))) {
              BVar16 = prvTidynodeIsAutonomousCustomFormat(pNVar18);
              if (((uVar17 & 0x60000) == 0) || (BVar16 == no)) {
                prvTidyReport((TidyDocImpl *)tdoc,(Node *)0x0,pNVar18,0x270);
              }
              if (pNVar18->tag != (Dict *)0x0) {
                TVar24 = pNVar18->tag->id;
                if (TVar24 == TidyTag_SPACER) {
                  *(byte *)&tdoc[0xd18]._opaque = (byte)tdoc[0xd18]._opaque | 1;
                }
                else if (TVar24 == TidyTag_NOBR) {
                  *(byte *)&tdoc[0xd18]._opaque = (byte)tdoc[0xd18]._opaque | 4;
                }
                else if (TVar24 == TidyTag_LAYER) {
                  *(byte *)&tdoc[0xd18]._opaque = (byte)tdoc[0xd18]._opaque | 2;
                }
              }
            }
          }
          else {
            prvTidyReport((TidyDocImpl *)tdoc,(Node *)0x0,pNVar18,bVar26 + 0x239);
          }
        }
        BVar16 = prvTidynodeIsElement(pNVar18);
        if (BVar16 != no) {
          pAVar19 = pNVar18->attributes;
          while (attval = pAVar19, attval != (AttVal *)0x0) {
            pAVar19 = attval->next;
            BVar16 = prvTidyAttributeIsProprietary(pNVar18,attval);
            if (bVar27 && iVar1 == 0) {
              BVar15 = no;
            }
            else {
              BVar15 = prvTidyAttributeIsMismatched(pNVar18,attval,(TidyDocImpl *)tdoc);
            }
            code = uVar25;
            BVar14 = BVar15;
            if (BVar16 != no) {
              code = 0x26f;
              BVar14 = tdoc[0xce]._opaque;
            }
            if (BVar14 != no) {
              prvTidyReportAttrError((TidyDocImpl *)tdoc,pNVar18,attval,code);
            }
            if ((BVar16 != no || BVar15 != no) && (tdoc[0x40]._opaque != 0)) {
              prvTidyRemoveAttribute((TidyDocImpl *)tdoc,pNVar18,attval);
            }
          }
        }
        if (pNVar18->content == (Node *)0x0) {
          if (pNVar22 == (Node *)0x0) {
            pNVar22 = prvTidypop(pSVar21);
          }
        }
        else {
          prvTidypush(pSVar21,pNVar22);
          pNVar22 = pNVar18->content;
        }
        pNVar18 = pNVar22;
      } while (pNVar22 != (Node *)0x0);
      prvTidyfreeStack(pSVar21);
      if ((*(int *)(*(long *)(tdoc + 0x1c) + 0x1c) == 0) && (tdoc[0xd1d]._opaque != 0)) {
        pNVar18 = prvTidyFindXmlDecl((TidyDocImpl *)tdoc);
        prvTidyReport((TidyDocImpl *)tdoc,(Node *)0x0,pNVar18,0x291);
      }
    }
    prvTidyCleanHead((TidyDocImpl *)tdoc);
  }
  *(undefined8 *)(tdoc + 0xd08) = uVar12;
  uVar17 = 2;
  if ((tdoc[0xd11]._opaque == 0) && (uVar17 = 1, tdoc[0xd12]._opaque == 0)) {
    uVar17 = (uint)(tdoc[0xd13]._opaque != 0);
  }
  return uVar17;
}

Assistant:

int TIDY_CALL        tidyCleanAndRepair( TidyDoc tdoc )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    if ( impl )
      return tidyDocCleanAndRepair( impl );
    return -EINVAL;
}